

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeIncAddFanins(SC_Man *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_ObjFanin(pObj,local_24);
    if (((*(uint *)&pObj_00->field_0x14 >> 6 & 1) == 0) &&
       (iVar1 = Abc_ObjIsLatch(pObj_00), iVar1 == 0)) {
      Abc_SclTimeIncAddNode(p,pObj_00);
    }
  }
  return;
}

Assistant:

static inline void Abc_SclTimeIncAddFanins( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    Abc_ObjForEachFanin( pObj, pFanin, i )
//        if ( !pFanin->fMarkC && Abc_ObjIsNode(pFanin) )
        if ( !pFanin->fMarkC && !Abc_ObjIsLatch(pFanin) )
            Abc_SclTimeIncAddNode( p, pFanin );
}